

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall Catch::AssertionHandler::complete(AssertionHandler *this)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  
  this->m_completed = true;
  if ((this->m_reaction).shouldDebugBreak == true) {
    bVar3 = isDebuggerActive();
    if (bVar3) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  if ((this->m_reaction).shouldThrow != true) {
    return;
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&TestFailureException::typeinfo,0);
}

Assistant:

void AssertionHandler::complete() {
        setCompleted();
        if( m_reaction.shouldDebugBreak ) {

            // If you find your debugger stopping you here then go one level up on the
            // call-stack for the code that caused it (typically a failed assertion)

            // (To go back to the test and change execution, jump over the throw, next)
            CATCH_BREAK_INTO_DEBUGGER();
        }
        if (m_reaction.shouldThrow) {
#if !defined(CATCH_CONFIG_DISABLE_EXCEPTIONS)
            throw Catch::TestFailureException();
#else
            CATCH_ERROR( "Test failure requires aborting test!" );
#endif
        }
    }